

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

ssize_t __thiscall
trial::protocol::buffer::array<unsigned_char,_1UL,_trial::protocol::buffer::base<unsigned_char>_>::
write(array<unsigned_char,_1UL,_trial::protocol::buffer::base<unsigned_char>_> *this,int __fd,
     void *__buf,size_t __n)

{
  uint uVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  uchar *puVar3;
  undefined4 in_register_00000034;
  basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
  *this_00;
  view_type *view_local;
  array<unsigned_char,_1UL,_trial::protocol::buffer::base<unsigned_char>_> *this_local;
  
  this_00 = (basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
             *)CONCAT44(in_register_00000034,__fd);
  sVar2 = std::
          basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
          ::size(this_00);
  uVar1 = (*(this->super_base<unsigned_char>)._vptr_base[2])(this,sVar2);
  if ((uVar1 & 1) == 0) {
    __assert_fail("grow(view.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/buffer/array.hpp"
                  ,0x4b,
                  "virtual void trial::protocol::buffer::array<unsigned char, 1>::write(const view_type &) [CharT = unsigned char, N = 1, Super = trial::protocol::buffer::base<unsigned char>]"
                 );
  }
  __first = std::
            basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
            ::begin(this_00);
  __last = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(this_00);
  puVar3 = std::copy<unsigned_char_const*,unsigned_char*>(__first,__last,this->current);
  this->current = puVar3;
  return (ssize_t)this;
}

Assistant:

virtual void write(const view_type& view)
    {
        assert(grow(view.size()));
        current = std::copy(view.begin(), view.end(), current);
    }